

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_positional_scan.cpp
# Opt level: O2

ProgressData * __thiscall
duckdb::PhysicalPositionalScan::GetProgress
          (ProgressData *__return_storage_ptr__,PhysicalPositionalScan *this,ClientContext *context,
          GlobalSourceState *gstate_p)

{
  PhysicalOperator *pPVar1;
  const_reference pvVar2;
  reference this_00;
  type pGVar3;
  size_t t;
  ulong __n;
  ProgressData local_48;
  
  __return_storage_ptr__->done = 0.0;
  __return_storage_ptr__->total = 0.0;
  __return_storage_ptr__->invalid = false;
  for (__n = 0; __n < (ulong)((long)(this->child_tables).
                                    super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                                    .
                                    super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->child_tables).
                                    super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                                    .
                                    super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3); __n = __n + 1)
  {
    pvVar2 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::get<true>
                       (&this->child_tables,__n);
    pPVar1 = pvVar2->_M_data;
    this_00 = vector<duckdb::unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>,_true>
              ::get<true>((vector<duckdb::unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>,_true>
                           *)(gstate_p + 1),__n);
    pGVar3 = unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
             ::operator*(this_00);
    (*pPVar1->_vptr_PhysicalOperator[0x17])(&local_48,pPVar1,context,pGVar3);
    ProgressData::Add(__return_storage_ptr__,&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

ProgressData PhysicalPositionalScan::GetProgress(ClientContext &context, GlobalSourceState &gstate_p) const {
	auto &gstate = gstate_p.Cast<PositionalScanGlobalSourceState>();

	ProgressData res;

	for (size_t t = 0; t < child_tables.size(); ++t) {
		res.Add(child_tables[t].get().GetProgress(context, *gstate.global_states[t]));
	}

	return res;
}